

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O1

double Abc_NtkCountNodes_rec(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *__ptr;
  uint uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  dVar7 = pNtk->dTemp;
  if (dVar7 < 0.0) {
    __ptr = Abc_NtkDfsBoxes(pNtk);
    dVar7 = 0.0;
    iVar1 = __ptr->nSize;
    if (0 < (long)iVar1) {
      ppvVar3 = __ptr->pArray;
      lVar5 = 0;
      do {
        uVar2 = *(uint *)((long)ppvVar3[lVar5] + 0x14);
        uVar4 = uVar2 & 0xf;
        if (uVar4 == 7) {
          dVar7 = dVar7 + 1.0;
        }
        else if (((uVar2 & 0xe) == 8 || uVar4 == 10) &&
                (pNtk_00 = *(Abc_Ntk_t **)((long)ppvVar3[lVar5] + 0x38), pNtk_00 != pNtk)) {
          dVar6 = Abc_NtkCountNodes_rec(pNtk_00);
          dVar7 = dVar7 + dVar6;
        }
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    if (__ptr != (Vec_Ptr_t *)0x0) {
      free(__ptr);
    }
    pNtk->dTemp = dVar7;
  }
  return dVar7;
}

Assistant:

double Abc_NtkCountNodes_rec( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pObj;
    double Counter = 0;
    int i;
    if ( pNtk->dTemp >= 0 )
        return pNtk->dTemp;
    vOrder = Abc_NtkDfsBoxes( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        if ( Abc_ObjIsNode(pObj) )
            Counter++;
        else if ( Abc_ObjIsBox(pObj) && (Abc_Ntk_t *)pObj->pData != pNtk )
            Counter += Abc_NtkCountNodes_rec( (Abc_Ntk_t *)pObj->pData );
    Vec_PtrFree( vOrder );
    return pNtk->dTemp = Counter;
}